

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_server.cpp
# Opt level: O2

bool __thiscall AutoReconnectConnection::disconnected(AutoReconnectConnection *this,bool imm)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"minibus disconnected");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&this->delay);
  poVar1 = std::operator<<((ostream *)&std::cout,"reconnecting");
  std::endl<char,std::char_traits<char>>(poVar1);
  return true;
}

Assistant:

bool disconnected(bool imm) override {
    std::cout << "minibus disconnected" << std::endl;
    std::this_thread::sleep_for(delay);
    std::cout << "reconnecting" << std::endl;
    return true;
  }